

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

void dirALIGN(void)

{
  uint len;
  bool preserveDeviceMemory;
  aint val;
  aint fill;
  aint local_10;
  int local_c;
  
  ParseAlignArguments(&lp,&local_10,&local_c);
  if (local_10 == -1) {
    local_10 = 4;
  }
  len = local_10 - 1U & -CurAddress;
  if (0 < (int)len) {
    preserveDeviceMemory = local_c == -1;
    if (preserveDeviceMemory) {
      local_c = 0;
    }
    EmitBlock(local_c,len,preserveDeviceMemory,4);
  }
  return;
}

Assistant:

static void dirALIGN() {
	// default alignment is 4, default filler is "0/none" (if not specified in directive explicitly)
	aint val, fill;
	ParseAlignArguments(lp, val, fill);
	if (-1 == val) val = 4;
	// calculate how many bytes has to be filled to reach desired alignment
	aint len = (~CurAddress + 1) & (val - 1);
	if (len < 1) return;		// nothing to fill, already aligned
	if (-1 == fill) EmitBlock(0, len, true);
	else			EmitBlock(fill, len, false);
}